

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O3

void __thiscall wasm::DataFlow::Trace::findExternalUses(Trace *this)

{
  __node_base_ptr *pp_Var1;
  pointer ppNVar2;
  ulong uVar3;
  long *plVar4;
  ulong uVar5;
  int iVar6;
  ostream *poVar7;
  Expression *pEVar8;
  __hash_code __code;
  Node **node;
  pointer ppNVar9;
  __hashtable *p_Var10;
  __hashtable *p_Var11;
  undefined1 local_c8 [8];
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  origins;
  __node_base _Stack_60;
  _Hashtable<wasm::DataFlow::Node*,wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>,std::__detail::_Identity,std::equal_to<wasm::DataFlow::Node*>,std::hash<wasm::DataFlow::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_58;
  __hashtable *__h;
  Expression *local_48;
  Expression *origin;
  pointer local_38;
  
  local_c8 = (undefined1  [8])&origins._M_h._M_rehash_policy._M_next_resize;
  origins._M_h._M_buckets = (__buckets_ptr)0x1;
  origins._M_h._M_bucket_count = 0;
  origins._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  origins._M_h._M_element_count._0_4_ = 0x3f800000;
  origins._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  origins._M_h._M_rehash_policy._4_4_ = 0;
  origins._M_h._M_rehash_policy._M_next_resize = 0;
  ppNVar9 = (this->nodes).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppNVar2 = (this->nodes).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar9 != ppNVar2) {
    pp_Var1 = &origins._M_h._M_single_bucket;
    do {
      local_48 = (*ppNVar9)->origin;
      if (local_48 != (Expression *)0x0) {
        iVar6 = debug();
        if (1 < iVar6) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"note origin ",0xc);
          poVar7 = std::ostream::_M_insert<void_const*>(&std::cout);
          origins._M_h._M_single_bucket =
               (__node_base_ptr)CONCAT71(origins._M_h._M_single_bucket._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)pp_Var1,1);
        }
        origins._M_h._M_single_bucket = (__node_base_ptr)local_c8;
        std::
        _Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<wasm::Expression*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Expression*,false>>>>
                  ((_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_c8,&stack0xffffffffffffffb8,pp_Var1);
      }
      ppNVar9 = ppNVar9 + 1;
    } while (ppNVar9 != ppNVar2);
    p_Var10 = (__hashtable *)
              (this->nodes).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    p_Var11 = (__hashtable *)
              (this->nodes).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (p_Var10 != p_Var11) {
      local_58 = (_Hashtable<wasm::DataFlow::Node*,wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>,std::__detail::_Identity,std::equal_to<wasm::DataFlow::Node*>,std::hash<wasm::DataFlow::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->hasExternalUses;
      pp_Var1 = &origins._M_h._M_single_bucket;
      __h = p_Var11;
      do {
        if (((Node *)p_Var10->_M_buckets != this->toInfer) &&
           (pEVar8 = ((Node *)p_Var10->_M_buckets)->origin, pEVar8 != (Expression *)0x0)) {
          origins._M_h._M_single_bucket = &_Stack_60;
          _Stack_60._M_nxt = (_Hash_node_base *)0x0;
          UseFinder::getUses((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &stack0xffffffffffffffb8,(UseFinder *)pp_Var1,pEVar8,this->graph,
                             this->localGraph);
          std::
          _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)pp_Var1);
          for (pEVar8 = local_48; pEVar8 != origin; pEVar8 = (Expression *)&pEVar8->type) {
            uVar3 = *(ulong *)pEVar8;
            if (uVar3 == 0) {
LAB_00b3c8ef:
              iVar6 = debug();
              p_Var11 = __h;
              if (1 < iVar6) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"found external use for\n",0x17);
                DataFlow::dump((Node *)p_Var10->_M_buckets,(ostream *)&std::cout,0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  due to ",9);
                poVar7 = std::ostream::_M_insert<void_const*>(&std::cout);
                origins._M_h._M_single_bucket =
                     (__node_base_ptr)CONCAT71(origins._M_h._M_single_bucket._1_7_,10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)pp_Var1,1);
              }
              origins._M_h._M_single_bucket = (__node_base_ptr)local_58;
              std::
              _Hashtable<wasm::DataFlow::Node*,wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>,std::__detail::_Identity,std::equal_to<wasm::DataFlow::Node*>,std::hash<wasm::DataFlow::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<wasm::DataFlow::Node*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::DataFlow::Node*,false>>>>
                        (local_58,p_Var10,pp_Var1);
              break;
            }
            if (*(long **)((long)local_c8 + (uVar3 % (ulong)origins._M_h._M_buckets) * 8) ==
                (long *)0x0) goto LAB_00b3c8ef;
            plVar4 = (long *)**(long **)((long)local_c8 +
                                        (uVar3 % (ulong)origins._M_h._M_buckets) * 8);
            uVar5 = plVar4[1];
            while (uVar3 != uVar5) {
              plVar4 = (long *)*plVar4;
              if ((plVar4 == (long *)0x0) ||
                 (uVar5 = plVar4[1],
                 uVar5 % (ulong)origins._M_h._M_buckets != uVar3 % (ulong)origins._M_h._M_buckets))
              goto LAB_00b3c8ef;
            }
            p_Var11 = __h;
          }
          if (local_48 != (Expression *)0x0) {
            operator_delete(local_48,(long)local_38 - (long)local_48);
          }
        }
        p_Var10 = (__hashtable *)&p_Var10->_M_bucket_count;
      } while (p_Var10 != p_Var11);
    }
  }
  std::
  _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_c8);
  return;
}

Assistant:

void findExternalUses() {
    // Find all the wasm code represented in this trace.
    std::unordered_set<Expression*> origins;
    for (auto& node : nodes) {
      if (auto* origin = node->origin) {
        if (debug() >= 2) {
          std::cout << "note origin " << origin << '\n';
        }
        origins.insert(origin);
      }
    }
    for (auto& node : nodes) {
      if (node == toInfer) {
        continue;
      }
      if (auto* origin = node->origin) {
        auto uses = UseFinder().getUses(origin, graph, localGraph);
        for (auto* use : uses) {
          // A non-set use (a drop or return etc.) is definitely external.
          // Otherwise, check if internal or external.
          if (use == nullptr || origins.count(use) == 0) {
            if (debug() >= 2) {
              std::cout << "found external use for\n";
              dump(node, std::cout);
              std::cout << "  due to " << use << '\n';
            }
            hasExternalUses.insert(node);
            break;
          }
        }
      }
    }
  }